

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::DBTest_MultiThreaded_Test::TestBody(DBTest_MultiThreaded_Test *this)

{
  SpecialEnv *pSVar1;
  bool bVar2;
  int local_a0;
  int local_9c;
  int id_2;
  int id_1;
  MTThread thread [4];
  int local_4c;
  DBTest_MultiThreaded_Test *pDStack_48;
  int id;
  MTState mt;
  DBTest_MultiThreaded_Test *this_local;
  memory_order __b;
  
  mt._24_8_ = this;
  do {
    pDStack_48 = this;
    std::atomic<bool>::store((atomic<bool> *)&mt,false,memory_order_release);
    for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
      std::operator&(memory_order_release,__memory_order_mask);
      mt.counter[(long)local_4c + -2].super___atomic_base<int>._M_i = 0;
      std::atomic<bool>::store
                ((atomic<bool> *)
                 ((long)&mt.counter[2].super___atomic_base<int>._M_i + (long)local_4c),false,
                 memory_order_release);
    }
    for (local_9c = 0; local_9c < 4; local_9c = local_9c + 1) {
      *(DBTest_MultiThreaded_Test ***)(&id_2 + (long)local_9c * 4) = &stack0xffffffffffffffb8;
      *(int *)&thread[local_9c].state = local_9c;
      pSVar1 = (this->super_DBTest).env_;
      (*(pSVar1->super_EnvWrapper).super_Env._vptr_Env[0x12])
                (pSVar1,anon_unknown_4::MTThreadBody,&id_2 + (long)local_9c * 4);
    }
    anon_unknown_4::DelayMilliseconds(10000);
    std::atomic<bool>::store((atomic<bool> *)&mt,true,memory_order_release);
    for (local_a0 = 0; local_a0 < 4; local_a0 = local_a0 + 1) {
      while (bVar2 = std::atomic<bool>::load
                               ((atomic<bool> *)
                                ((long)&mt.counter[2].super___atomic_base<int>._M_i + (long)local_a0
                                ),memory_order_acquire), ((bVar2 ^ 0xffU) & 1) != 0) {
        anon_unknown_4::DelayMilliseconds(100);
      }
    }
    bVar2 = DBTest::ChangeOptions(&this->super_DBTest);
  } while (bVar2);
  return;
}

Assistant:

TEST_F(DBTest, MultiThreaded) {
  do {
    // Initialize state
    MTState mt;
    mt.test = this;
    mt.stop.store(false, std::memory_order_release);
    for (int id = 0; id < kNumThreads; id++) {
      mt.counter[id].store(false, std::memory_order_release);
      mt.thread_done[id].store(false, std::memory_order_release);
    }

    // Start threads
    MTThread thread[kNumThreads];
    for (int id = 0; id < kNumThreads; id++) {
      thread[id].state = &mt;
      thread[id].id = id;
      env_->StartThread(MTThreadBody, &thread[id]);
    }

    // Let them run for a while
    DelayMilliseconds(kTestSeconds * 1000);

    // Stop the threads and wait for them to finish
    mt.stop.store(true, std::memory_order_release);
    for (int id = 0; id < kNumThreads; id++) {
      while (!mt.thread_done[id].load(std::memory_order_acquire)) {
        DelayMilliseconds(100);
      }
    }
  } while (ChangeOptions());
}